

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O1

uint SOIL_load_OGL_HDR_texture
               (char *filename,int fake_HDR_format,int rescale_to_max,uint reuse_texture_ID,
               uint flags)

{
  uint uVar1;
  stbi_uc *image;
  int height;
  int width;
  int channels;
  
  if ((uint)fake_HDR_format < 3) {
    image = stbi_hdr_load_rgbe(filename,&width,&height,&channels,4);
    if (image != (stbi_uc *)0x0) {
      if (fake_HDR_format == 2) {
        RGBE_to_RGBdivA2(image,width,height,rescale_to_max);
      }
      else if (fake_HDR_format == 1) {
        RGBE_to_RGBdivA(image,width,height,rescale_to_max);
      }
      uVar1 = SOIL_internal_create_OGL_texture
                        (image,width,height,channels,reuse_texture_ID,flags,0xde1,0xde1,0xd33);
      free(image);
      return uVar1;
    }
    result_string_pointer = stbi_failure_reason();
  }
  else {
    result_string_pointer = "Invalid fake HDR format specified";
  }
  return 0;
}

Assistant:

unsigned int
	SOIL_load_OGL_HDR_texture
	(
		const char *filename,
		int fake_HDR_format,
		int rescale_to_max,
		unsigned int reuse_texture_ID,
		unsigned int flags
	)
{
	/*	variables	*/
	unsigned char* img;
	int width, height, channels;
	unsigned int tex_id;
	/*	no direct uploading of the image as a DDS file	*/
	/* error check */
	if( (fake_HDR_format != SOIL_HDR_RGBE) &&
		(fake_HDR_format != SOIL_HDR_RGBdivA) &&
		(fake_HDR_format != SOIL_HDR_RGBdivA2) )
	{
		result_string_pointer = "Invalid fake HDR format specified";
		return 0;
	}
	/*	try to load the image (only the HDR type) */
	img = stbi_hdr_load_rgbe( filename, &width, &height, &channels, 4 );
	/*	channels holds the original number of channels, which may have been forced	*/
	if( NULL == img )
	{
		/*	image loading failed	*/
		result_string_pointer = stbi_failure_reason();
		return 0;
	}
	/* the load worked, do I need to convert it? */
	if( fake_HDR_format == SOIL_HDR_RGBdivA )
	{
		RGBE_to_RGBdivA( img, width, height, rescale_to_max );
	} else if( fake_HDR_format == SOIL_HDR_RGBdivA2 )
	{
		RGBE_to_RGBdivA2( img, width, height, rescale_to_max );
	}
	/*	OK, make it a texture!	*/
	tex_id = SOIL_internal_create_OGL_texture(
			img, width, height, channels,
			reuse_texture_ID, flags,
			GL_TEXTURE_2D, GL_TEXTURE_2D,
			GL_MAX_TEXTURE_SIZE );
	/*	and nuke the image data	*/
	SOIL_free_image_data( img );
	/*	and return the handle, such as it is	*/
	return tex_id;
}